

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int copy_from_lzss_window(archive_read *a,void **buffer,int64_t startpos,int length)

{
  void *pvVar1;
  void *pvVar2;
  char *fmt;
  int iVar3;
  void *__src;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pvVar2 = a->format->data;
  pvVar1 = *(void **)((long)pvVar2 + 0xd8);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = malloc((ulong)*(uint *)((long)pvVar2 + 0xd0));
    *(void **)((long)pvVar2 + 0xd8) = pvVar1;
    if (pvVar1 != (void *)0x0) goto LAB_004f0142;
    fmt = "Unable to allocate memory for uncompressed data.";
    iVar3 = 0xc;
LAB_004f0205:
    archive_set_error(&a->archive,iVar3,fmt);
    iVar3 = -0x1e;
  }
  else {
LAB_004f0142:
    uVar6 = (uint)startpos & *(uint *)((long)pvVar2 + 0x328);
    iVar4 = *(uint *)((long)pvVar2 + 0x328) + 1;
    iVar3 = length;
    if (iVar4 < (int)(uVar6 + length)) {
      uVar5 = iVar4 - uVar6;
      if ((int)uVar5 < 0) {
        fmt = "Bad RAR file data";
        iVar3 = 0x54;
        goto LAB_004f0205;
      }
      pvVar1 = (void *)((long)pvVar1 + (ulong)*(uint *)((long)pvVar2 + 0xcc));
      __src = (void *)((long)(int)uVar6 + *(long *)((long)pvVar2 + 800));
      if (length - uVar5 != 0 && (int)uVar5 <= length) {
        memcpy(pvVar1,__src,(ulong)uVar5);
        pvVar1 = (void *)((ulong)(uVar5 + *(int *)((long)pvVar2 + 0xcc)) +
                         *(long *)((long)pvVar2 + 0xd8));
        __src = *(void **)((long)pvVar2 + 800);
        iVar3 = length - uVar5;
      }
    }
    else {
      pvVar1 = (void *)((long)pvVar1 + (ulong)*(uint *)((long)pvVar2 + 0xcc));
      __src = (void *)((long)(int)uVar6 + *(long *)((long)pvVar2 + 800));
    }
    memcpy(pvVar1,__src,(long)iVar3);
    uVar6 = length + *(int *)((long)pvVar2 + 0xcc);
    *(uint *)((long)pvVar2 + 0xcc) = uVar6;
    iVar3 = 0;
    if (uVar6 < *(uint *)((long)pvVar2 + 0xd0)) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = *(void **)((long)pvVar2 + 0xd8);
    }
    *buffer = pvVar2;
  }
  return iVar3;
}

Assistant:

static int
copy_from_lzss_window(struct archive_read *a, const void **buffer,
                        int64_t startpos, int length)
{
  int windowoffs, firstpart;
  struct rar *rar = (struct rar *)(a->format->data);

  if (!rar->unp_buffer)
  {
    if ((rar->unp_buffer = malloc(rar->unp_buffer_size)) == NULL)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
  }

  windowoffs = lzss_offset_for_position(&rar->lzss, startpos);
  if(windowoffs + length <= lzss_size(&rar->lzss))
    memcpy(&rar->unp_buffer[rar->unp_offset], &rar->lzss.window[windowoffs],
           length);
  else
  {
    firstpart = lzss_size(&rar->lzss) - windowoffs;
    if (firstpart < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file data");
      return (ARCHIVE_FATAL);
    }
    if (firstpart < length) {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], firstpart);
      memcpy(&rar->unp_buffer[rar->unp_offset + firstpart],
             &rar->lzss.window[0], length - firstpart);
    } else
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], length);
  }
  rar->unp_offset += length;
  if (rar->unp_offset >= rar->unp_buffer_size)
    *buffer = rar->unp_buffer;
  else
    *buffer = NULL;
  return (ARCHIVE_OK);
}